

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpermissions.cpp
# Opt level: O2

QDebug operator<<(QDebug debug,QPermission *permission)

{
  int iVar1;
  _func_int **pp_Var2;
  QMetaType QVar3;
  QDebug *this;
  long in_RDX;
  char *t;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  QDebug local_40;
  QDebug local_38;
  QDebugStateSaver local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = *(int *)(*(long *)permission + 0x34);
  local_30.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&local_30,(QDebug *)permission);
  local_40.stream = *(Stream **)permission;
  (local_40.stream)->space = false;
  (local_40.stream)->verbosity = 0;
  if (1 < iVar1) {
    QVar3 = QVariant::metaType((QVariant *)(in_RDX + 8));
    if (QVar3.d_ptr == (QMetaTypeInterface *)0x0) {
      t = (char *)0x0;
    }
    else {
      t = (QVar3.d_ptr)->name;
    }
    this = QDebug::operator<<((QDebug *)permission,t);
    QDebug::operator<<(this,"(");
    local_40.stream = *(Stream **)permission;
  }
  (local_40.stream)->ref = (local_40.stream)->ref + 1;
  operator<<((Stream *)&local_38,(PermissionStatus)&local_40);
  QDebug::~QDebug(&local_38);
  QDebug::~QDebug(&local_40);
  if (1 < iVar1) {
    QDebug::operator<<((QDebug *)permission,")");
  }
  pp_Var2 = *(_func_int ***)permission;
  *(undefined8 *)permission = 0;
  ((debug.stream)->ts)._vptr_QTextStream = pp_Var2;
  QDebugStateSaver::~QDebugStateSaver(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (QDebug)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, const QPermission &permission)
{
    const auto verbosity = debug.verbosity();
    QDebugStateSaver saver(debug);
    debug.nospace().setVerbosity(0);
    if (verbosity >= QDebug::DefaultVerbosity)
        debug << permission.type().name() << "(";
    debug << permission.status();
    if (verbosity >= QDebug::DefaultVerbosity)
        debug << ")";
    return debug;
}